

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O2

void __thiscall
MT32Emu::PartialManager::PartialManager(PartialManager *this,Synth *useSynth,Part **useParts)

{
  Bit32u BVar1;
  Partial **ppPVar2;
  int *piVar3;
  Poly **ppPVar4;
  Partial *this_00;
  Poly *this_01;
  int iVar5;
  ulong uVar6;
  
  this->synth = useSynth;
  this->parts = useParts;
  BVar1 = Synth::getPartialCount(useSynth);
  this->inactivePartialCount = BVar1;
  ppPVar2 = (Partial **)operator_new__((ulong)BVar1 * 8);
  this->partialTable = ppPVar2;
  piVar3 = (int *)operator_new__((ulong)BVar1 << 2);
  this->inactivePartials = piVar3;
  BVar1 = Synth::getPartialCount(this->synth);
  ppPVar4 = (Poly **)operator_new__((ulong)BVar1 << 3);
  this->freePolys = ppPVar4;
  this->firstFreePolyIndex = 0;
  iVar5 = -1;
  uVar6 = 0;
  while( true ) {
    BVar1 = Synth::getPartialCount(this->synth);
    if (BVar1 <= uVar6) break;
    this_00 = (Partial *)operator_new(0x118);
    Partial::Partial(this_00,this->synth,(int)uVar6);
    this->partialTable[uVar6] = this_00;
    this->inactivePartials[uVar6] = this->inactivePartialCount + iVar5;
    this_01 = (Poly *)operator_new(0x48);
    Poly::Poly(this_01);
    this->freePolys[uVar6] = this_01;
    uVar6 = uVar6 + 1;
    iVar5 = iVar5 + -1;
  }
  return;
}

Assistant:

PartialManager::PartialManager(Synth *useSynth, Part **useParts) {
	synth = useSynth;
	parts = useParts;
	inactivePartialCount = synth->getPartialCount();
	partialTable = new Partial *[inactivePartialCount];
	inactivePartials = new int[inactivePartialCount];
	freePolys = new Poly *[synth->getPartialCount()];
	firstFreePolyIndex = 0;
	for (unsigned int i = 0; i < synth->getPartialCount(); i++) {
		partialTable[i] = new Partial(synth, i);
		inactivePartials[i] = inactivePartialCount - i - 1;
		freePolys[i] = new Poly();
	}
}